

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_finite_automaton.cpp
# Opt level: O0

FiniteAutomaton *
Omega_h::FiniteAutomaton::maybe
          (FiniteAutomaton *__return_storage_ptr__,FiniteAutomaton *a,int token)

{
  int iVar1;
  int iVar2;
  int at_symbol;
  int iVar3;
  undefined4 local_4c;
  undefined4 local_48;
  int i;
  int last;
  int epsilon1;
  int epsilon0;
  int new_accept_state;
  int offset;
  int new_start_state;
  int token_local;
  FiniteAutomaton *a_local;
  FiniteAutomaton *out;
  
  iVar1 = get_nsymbols(a);
  iVar2 = get_nstates(a);
  FiniteAutomaton(__return_storage_ptr__,iVar1,false,iVar2 + 2);
  local_48 = add_state(__return_storage_ptr__);
  iVar1 = get_nstates(__return_storage_ptr__);
  append_states(__return_storage_ptr__,a);
  iVar2 = add_state(__return_storage_ptr__);
  at_symbol = get_epsilon0(__return_storage_ptr__);
  iVar3 = get_epsilon1(__return_storage_ptr__);
  add_transition(__return_storage_ptr__,local_48,iVar3,iVar1);
  for (local_4c = 0; iVar3 = get_nstates(a), local_4c < iVar3; local_4c = local_4c + 1) {
    iVar3 = accepts(a,local_4c);
    if (iVar3 != -1) {
      add_transition(__return_storage_ptr__,local_48,at_symbol,local_4c + iVar1);
      remove_accept(__return_storage_ptr__,local_4c + iVar1);
      local_48 = local_4c + iVar1;
    }
  }
  add_transition(__return_storage_ptr__,local_48,at_symbol,iVar2);
  add_accept(__return_storage_ptr__,iVar2,token);
  return __return_storage_ptr__;
}

Assistant:

FiniteAutomaton FiniteAutomaton::maybe(FiniteAutomaton const& a, int token) {
  FiniteAutomaton out(get_nsymbols(a), false, get_nstates(a) + 2);
  auto new_start_state = add_state(out);
  auto offset = get_nstates(out);
  append_states(out, a);
  auto new_accept_state = add_state(out);
  auto epsilon0 = get_epsilon0(out);
  auto epsilon1 = get_epsilon1(out);
  add_transition(out, new_start_state, epsilon1, offset);
  /* form an epsilon0 linked list of new start state,
     all old accepting states, and new accepting state */
  auto last = new_start_state;
  for (int i = 0; i < get_nstates(a); ++i) {
    if (accepts(a, i) != -1) {
      add_transition(out, last, epsilon0, i + offset);
      remove_accept(out, i + offset);
      last = i + offset;
    }
  }
  add_transition(out, last, epsilon0, new_accept_state);
  add_accept(out, new_accept_state, token);
  return out;
}